

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O2

string * __thiscall
Control::toStr_abi_cxx11_(string *__return_storage_ptr__,Control *this,Network *nw)

{
  ostream *poVar1;
  long lVar2;
  int seconds;
  int seconds_00;
  char *pcVar3;
  stringstream local_1d8 [8];
  stringstream s;
  ostream local_1c8 [376];
  string local_50;
  
  std::__cxx11::stringstream::stringstream(local_1d8);
  poVar1 = std::operator<<(local_1c8,"Link ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->link->super_Element).name);
  std::operator<<(poVar1," ");
  poVar1 = local_1c8;
  if (this->status == 1) {
    pcVar3 = "OPEN";
  }
  else if (this->status == 0) {
    pcVar3 = "CLOSED";
  }
  else {
    pcVar3 = " ";
    std::operator<<(local_1c8," ");
    poVar1 = std::ostream::_M_insert<double>(this->setting);
  }
  std::operator<<(poVar1,pcVar3);
  switch(*(undefined4 *)&(this->super_Element).field_0x2c) {
  case 0:
    poVar1 = std::operator<<(local_1c8," IF NODE ");
    poVar1 = std::operator<<(poVar1,(string *)&(this->node->super_Element).name);
    std::operator<<(poVar1," ");
    pcVar3 = "ABOVE";
    if (this->levelType == LOW_LEVEL) {
      pcVar3 = "BELOW";
    }
    std::operator<<(local_1c8,pcVar3);
    std::operator<<(local_1c8," ");
    lVar2 = 200;
    break;
  case 1:
    poVar1 = std::operator<<(local_1c8," IF NODE ");
    poVar1 = std::operator<<(poVar1,(string *)&(this->node->super_Element).name);
    std::operator<<(poVar1," ");
    pcVar3 = "ABOVE";
    if (this->levelType == LOW_LEVEL) {
      pcVar3 = "BELOW";
    }
    std::operator<<(local_1c8,pcVar3);
    std::operator<<(local_1c8," ");
    lVar2 = 0xe0;
    break;
  case 2:
    poVar1 = std::operator<<(local_1c8," AT TIME ");
    Utilities::getTime_abi_cxx11_(&local_50,(Utilities *)(ulong)(uint)this->time,seconds);
    std::operator<<(poVar1,(string *)&local_50);
    goto LAB_0012bddd;
  case 3:
    poVar1 = std::operator<<(local_1c8," AT CLOCKTIME ");
    Utilities::getTime_abi_cxx11_(&local_50,(Utilities *)(ulong)(uint)this->time,seconds_00);
    std::operator<<(poVar1,(string *)&local_50);
LAB_0012bddd:
    std::__cxx11::string::~string((string *)&local_50);
  default:
    goto switchD_0012bd1d_default;
  }
  std::ostream::_M_insert<double>
            ((this->head - this->node->elev) *
             *(double *)
              ((long)&(nw->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar2));
switchD_0012bd1d_default:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1d8);
  return __return_storage_ptr__;
}

Assistant:

string Control::toStr(Network* nw)
{
    // ... write Link name and its control action

    stringstream s;
    s << "Link " << link->name << " ";
    if ( status == CLOSED_STATUS )    s << "CLOSED";
    else if ( status == OPEN_STATUS ) s << "OPEN";
    else s << " " << setting << " ";

    // ... write node condition or time causing the action

    switch (type)
    {
    case TANK_LEVEL:
        s << " IF NODE " << node->name << " ";
        if ( levelType == LOW_LEVEL ) s << "BELOW";
        else s << "ABOVE";
        s << " " << (head - node->elev) * nw->ucf(Units::LENGTH);
        break;

    case PRESSURE_LEVEL:
        s << " IF NODE " << node->name << " ";
        if ( levelType == LOW_LEVEL ) s << "BELOW";
        else s << "ABOVE";
        s << " " << (head - node->elev) * nw->ucf(Units::PRESSURE);
        break;

    case ELAPSED_TIME:
        s << " AT TIME " <<  Utilities::getTime(time);
        break;

    case TIME_OF_DAY:
        s << " AT CLOCKTIME " << Utilities::getTime(time);
        break;
    }
    return s.str();
}